

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_18::DoInlining::runOnFunction(DoInlining *this,Module *module,Function *func)

{
  undefined8 *puVar1;
  const_iterator cVar2;
  const_iterator __begin2;
  undefined8 *puVar3;
  undefined1 auStack_48 [8];
  InliningAction action;
  
  cVar2 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->chosenActions->_M_h,(key_type *)func);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    __assert_fail("iter != chosenActions.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                  ,0x29c,
                  "virtual void wasm::(anonymous namespace)::DoInlining::runOnFunction(Module *, Function *)"
                 );
  }
  puVar3 = *(undefined8 **)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
                   ._M_cur + 0x18);
  puVar1 = *(undefined8 **)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::(anonymous_namespace)::InliningAction,_std::allocator<wasm::(anonymous_namespace)::InliningAction>_>_>,_true>
                   ._M_cur + 0x20);
  if (puVar3 == puVar1) {
    __assert_fail("!actions.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                  ,0x29e,
                  "virtual void wasm::(anonymous namespace)::DoInlining::runOnFunction(Module *, Function *)"
                 );
  }
  for (; puVar3 != puVar1; puVar3 = puVar3 + 3) {
    action.contents = (Function *)puVar3[2];
    auStack_48 = (undefined1  [8])*puVar3;
    action.callSite = (Expression **)puVar3[1];
    doCodeInlining(module,func,(InliningAction *)auStack_48,&((this->super_Pass).runner)->options);
  }
  updateAfterInlining(module,func);
  return;
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    auto iter = chosenActions.find(func->name);
    // We must be called on a function that we actually want to inline into.
    assert(iter != chosenActions.end());
    const auto& actions = iter->second;
    assert(!actions.empty());

    // Inline all the code first, then update func once at the end (which saves
    // e.g. running ReFinalize after each action, of which there might be many).
    for (auto action : actions) {
      doCodeInlining(module, func, action, getPassOptions());
    }
    updateAfterInlining(module, func);
  }